

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool is_id_char(int32_t c)

{
  ulong uVar1;
  uint8_t *puVar2;
  
  if (c == 0x27) {
    return true;
  }
  if (c == 0x5f) {
    return true;
  }
  if (c < 0x30) {
    return false;
  }
  if ((uint)c < 0x4e01) {
    uVar1 = (ulong)(c - 0x30U >> 3);
    puVar2 = bitmap_identifier_1;
  }
  else {
    if ((uint)c < 0x9fff) {
      return false;
    }
    if ((uint)c < 0xac01) {
      c = c - 0x9fff;
      uVar1 = (ulong)((uint)c >> 3);
      puVar2 = bitmap_identifier_2;
    }
    else {
      if ((uint)c < 0xd7a3) {
        return false;
      }
      if ((uint)c < 0x20001) {
        c = c - 0xd7a3;
        uVar1 = (ulong)((uint)c >> 3);
        puVar2 = bitmap_identifier_3;
      }
      else {
        if ((uint)c < 0x2a6df) {
          return false;
        }
        if (0x323af < (uint)c) {
          return c - 0xe0100U < 0xf0;
        }
        c = c - 0x2a6df;
        uVar1 = (ulong)((uint)c >> 3);
        puVar2 = "\x01";
      }
    }
  }
  return (puVar2[uVar1] >> (c & 7U) & 1) != 0;
}

Assistant:

static bool is_id_char(const int32_t c) {
  return c == '_' || c == '\'' || is_identifier_char(c);
}